

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
          (iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  key_prefix_snapshot kVar1;
  art_key_type node_00;
  bool bVar2;
  byte bVar3;
  value_type vVar4;
  value_type vVar5;
  uint8_t uVar6;
  node_type nVar7;
  uint uVar8;
  int iVar9;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_00;
  uint64_t shifted_key_u64;
  iterator *piVar10;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar11;
  node_ptr nVar12;
  iter_result<unodb::detail::node_header> *piVar13;
  void *extraout_RDX;
  find_result fVar14;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_230;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_228;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *child;
  uchar child_index;
  node_ptr child_1;
  uint8_t child_index_1;
  iter_result<unodb::detail::node_header> *tmp;
  node_ptr nchild_1;
  iter_result_opt cnxt_1;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *icnode_1;
  node_ptr cnode_1;
  stack_entry *centry_1;
  iter_result_opt nxt;
  node_ptr child_2;
  uint8_t child_index_2;
  iter_result<unodb::detail::node_header> *tmp_1;
  node_ptr nchild;
  iter_result_opt cnxt;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *icnode;
  node_ptr cnode;
  stack_entry *centry;
  iter_result_opt nxt_1;
  find_result res;
  int cmp__1;
  uint shared_length;
  key_prefix_size key_prefix_length;
  key_prefix_snapshot key_prefix;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  int local_64;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_60;
  int cmp_;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *local_58;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_48;
  node_type node_type;
  art_key_type remaining_key;
  art_key_type k;
  node_ptr node;
  bool fwd_local;
  bool *match_local;
  iterator *this_local;
  art_key_type search_key_local;
  
  invalidate(this);
  *match = false;
  bVar2 = detail::basic_node_ptr<unodb::detail::node_header>::operator==
                    (&this->db_->root,(nullptr_t)0x0);
  search_key_local.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)this;
  if (!bVar2) {
    k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                (this->db_->root).tagged_ptr;
    aStack_48 = search_key.field_0;
    remaining_key.field_0 = search_key.field_0;
    while (leaf._7_1_ = detail::basic_node_ptr<unodb::detail::node_header>::type
                                  ((basic_node_ptr<unodb::detail::node_header> *)&k),
          leaf._7_1_ != LEAF) {
      if (leaf._7_1_ == LEAF) {
        __assert_fail("node_type != node_type::LEAF",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x4bd,
                      "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      key_prefix = (key_prefix_snapshot)
                   detail::basic_node_ptr<unodb::detail::node_header>::
                   ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                             ((basic_node_ptr<unodb::detail::node_header> *)&k);
      this_00 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                                  *)key_prefix);
      _shared_length =
           detail::
           key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
           ::get_snapshot((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                           *)&this_00->f);
      bVar3 = detail::key_prefix_snapshot::length((key_prefix_snapshot *)&shared_length);
      shifted_key_u64 =
           detail::basic_art_key<unsigned_long>::get_u64
                     ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8);
      uVar8 = detail::key_prefix_snapshot::get_shared_length
                        ((key_prefix_snapshot *)&shared_length,shifted_key_u64);
      if (uVar8 < bVar3) {
        vVar4 = detail::basic_art_key<unsigned_long>::operator[]
                          ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,(ulong)uVar8);
        vVar5 = detail::key_prefix_snapshot::operator[]
                          ((key_prefix_snapshot *)&shared_length,(ulong)uVar8);
        iVar9 = (uint)vVar4 - (uint)vVar5;
        if ((uint)vVar4 == (uint)vVar5) {
          __assert_fail("cmp_ != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x4ce,
                        "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        if (fwd) {
          if (iVar9 < 0) {
            piVar10 = left_most_traversal(this,(node_ptr)k.field_0);
            return piVar10;
          }
          piVar10 = right_most_traversal(this,(node_ptr)k.field_0);
          piVar10 = next(piVar10);
          return piVar10;
        }
        if (iVar9 < 0) {
          piVar10 = left_most_traversal(this,(node_ptr)k.field_0);
          piVar10 = prior(piVar10);
          return piVar10;
        }
        piVar10 = right_most_traversal(this,(node_ptr)k.field_0);
        return piVar10;
      }
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,(ulong)bVar3);
      nVar7 = leaf._7_1_;
      kVar1 = key_prefix;
      vVar4 = detail::basic_art_key<unsigned_long>::operator[]
                        ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,0);
      fVar14 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             *)kVar1,nVar7,vVar4);
      node_00 = k;
      nVar7 = leaf._7_1_;
      kVar1 = key_prefix;
      uVar6 = fVar14.first;
      nxt_1.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_engaged = (bool)uVar6;
      if ((in_fake_critical_section *)fVar14.second == (in_fake_critical_section *)0x0) {
        if (!fwd) {
          vVar4 = detail::basic_art_key<unsigned_long>::operator[]
                            ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,0);
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::lte_key_byte((iter_result_opt *)&centry_1,
                         (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                          *)kVar1,nVar7,vVar4);
          bVar2 = std::optional::operator_cast_to_bool((optional *)&centry_1);
          if (bVar2) {
            piVar13 = std::optional<unodb::detail::iter_result<unodb::detail::node_header>_>::value
                                ((optional<unodb::detail::iter_result<unodb::detail::node_header>_>
                                  *)&centry_1);
            uVar6 = piVar13->child_index;
            nVar12 = detail::
                     basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                     ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                                  *)key_prefix,leaf._7_1_,uVar6);
            push(this,(node_ptr)k.field_0,piVar13->key_byte,uVar6,piVar13->prefix);
            piVar10 = right_most_traversal(this,(node_ptr)nVar12.tagged_ptr);
            return piVar10;
          }
          bVar2 = empty(this);
          if (!bVar2) {
            pop(this);
          }
          while( true ) {
            bVar2 = empty(this);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              return this;
            }
            cnode_1.tagged_ptr = (uintptr_t)top(this);
            icnode_1 = (inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                       (((stack_entry *)cnode_1.tagged_ptr)->node).tagged_ptr;
            pbVar11 = &detail::basic_node_ptr<unodb::detail::node_header>::
                       ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                                 ((basic_node_ptr<unodb::detail::node_header> *)&icnode_1)->
                       super_inode_base<unsigned_long,_std::span<const_std::byte>_>;
            nVar7 = detail::basic_node_ptr<unodb::detail::node_header>::type
                              ((basic_node_ptr<unodb::detail::node_header> *)&icnode_1);
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::prior((iter_result_opt *)&nchild_1,pbVar11,nVar7,*(uint8_t *)(cnode_1.tagged_ptr + 9))
            ;
            bVar2 = std::optional::operator_cast_to_bool((optional *)&nchild_1);
            if (bVar2) break;
            pop(this);
          }
          nVar7 = detail::basic_node_ptr<unodb::detail::node_header>::type
                            ((basic_node_ptr<unodb::detail::node_header> *)&icnode_1);
          nVar12 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   ::get_child(pbVar11,nVar7,*(uint8_t *)(cnode_1.tagged_ptr + 9));
          piVar10 = right_most_traversal(this,(node_ptr)nVar12.tagged_ptr);
          return piVar10;
        }
        vVar4 = detail::basic_art_key<unsigned_long>::operator[]
                          ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,0);
        detail::
        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::gte_key_byte((iter_result_opt *)&centry,
                       (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                        *)kVar1,nVar7,vVar4);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&centry);
        if (bVar2) {
          piVar13 = std::optional<unodb::detail::iter_result<unodb::detail::node_header>_>::value
                              ((optional<unodb::detail::iter_result<unodb::detail::node_header>_> *)
                               &centry);
          uVar6 = piVar13->child_index;
          nVar12 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                                *)key_prefix,leaf._7_1_,uVar6);
          push(this,(node_ptr)k.field_0,piVar13->key_byte,uVar6,piVar13->prefix);
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
          _24_8_ = nVar12;
          piVar10 = left_most_traversal(this,(node_ptr)nVar12.tagged_ptr);
          return piVar10;
        }
        bVar2 = empty(this);
        if (!bVar2) {
          pop(this);
        }
        while( true ) {
          bVar2 = empty(this);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            return this;
          }
          cnode.tagged_ptr = (uintptr_t)top(this);
          icnode = (inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                   (((stack_entry *)cnode.tagged_ptr)->node).tagged_ptr;
          pbVar11 = &detail::basic_node_ptr<unodb::detail::node_header>::
                     ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                               ((basic_node_ptr<unodb::detail::node_header> *)&icnode)->
                     super_inode_base<unsigned_long,_std::span<const_std::byte>_>;
          nVar7 = detail::basic_node_ptr<unodb::detail::node_header>::type
                            ((basic_node_ptr<unodb::detail::node_header> *)&icnode);
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::next((iter_result_opt *)&nchild,pbVar11,nVar7,*(uint8_t *)(cnode.tagged_ptr + 9));
          bVar2 = std::optional::operator_cast_to_bool((optional *)&nchild);
          if (bVar2) break;
          pop(this);
        }
        nVar7 = detail::basic_node_ptr<unodb::detail::node_header>::type
                          ((basic_node_ptr<unodb::detail::node_header> *)&icnode);
        nVar12 = detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 ::get_child(pbVar11,nVar7,*(uint8_t *)(cnode.tagged_ptr + 9));
        piVar10 = left_most_traversal(this,(node_ptr)nVar12.tagged_ptr);
        return piVar10;
      }
      vVar4 = detail::basic_art_key<unsigned_long>::operator[]
                        ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,0);
      push(this,(node_ptr)node_00.field_0,vVar4,uVar6,_shared_length);
      k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                  in_fake_critical_section::operator_cast_to_basic_node_ptr
                            ((in_fake_critical_section *)fVar14.second);
      detail::basic_art_key<unsigned_long>::shift_right
                ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffb8,1);
    }
    local_58 = detail::basic_node_ptr<unodb::detail::node_header>::
               ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>
                         ((basic_node_ptr<unodb::detail::node_header> *)&k);
    aStack_60 = k.field_0;
    push_leaf(this,(node_ptr)k.field_0);
    inode = (inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
            remaining_key.field_0;
    local_64 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                         (local_58,(void *)remaining_key.field_0,extraout_RDX);
    if (local_64 == 0) {
      *match = true;
    }
    else if (fwd) {
      local_228 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)this;
      if (-1 < local_64) {
        local_228 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)next(this);
      }
      search_key_local.field_0 =
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)local_228.key_bytes._M_elems;
    }
    else {
      local_230 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)this;
      if (local_64 < 1) {
        local_230 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)prior(this);
      }
      search_key_local.field_0 =
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)local_230.key_bytes._M_elems;
    }
  }
  return (iterator *)search_key_local.field_0.key;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}